

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QMenu * __thiscall
QWidgetTextControl::createStandardContextMenu(QWidgetTextControl *this,QPointF *pos,QWidget *parent)

{
  uint uVar1;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  byte bVar7;
  char cVar8;
  uint uVar9;
  QAction *pQVar10;
  QUnicodeControlCharacterMenu *this_00;
  QKeySequence *pQVar11;
  long in_FS_OFFSET;
  QWidget *local_2c0;
  QKeySequence local_2a0 [8];
  QArrayDataPointer<char16_t> local_298;
  QStringBuilder<char16_t,_QString> local_278;
  QKeySequence local_250 [8];
  QArrayDataPointer<char16_t> local_248;
  QKeySequence local_230 [8];
  QArrayDataPointer<char16_t> local_228;
  QStringBuilder<char16_t,_QString> local_208;
  QKeySequence local_1e0 [8];
  QArrayDataPointer<char16_t> local_1d8;
  QKeySequence local_1c0 [8];
  QArrayDataPointer<char16_t> local_1b8;
  QStringBuilder<char16_t,_QString> local_198;
  QKeySequence local_170 [8];
  QArrayDataPointer<char16_t> local_168;
  QKeySequence local_150 [8];
  QArrayDataPointer<char16_t> local_148;
  QStringBuilder<char16_t,_QString> local_128;
  QKeySequence local_108 [8];
  QKeySequence local_100 [8];
  QArrayDataPointer<char16_t> local_f8;
  QStringBuilder<char16_t,_QString> local_d8;
  QKeySequence local_b8 [8];
  QKeySequence local_b0 [8];
  QArrayDataPointer<char16_t> local_a8;
  QStringBuilder<char16_t,_QString> local_90;
  QKeySequence local_70 [8];
  QStringBuilder<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  uVar1 = *(uint *)(lVar2 + 0xb0);
  local_68.a.d.d = *(Data **)(lVar2 + 0x198);
  local_68.a.d.ptr = *(char16_t **)(lVar2 + 0x1a0);
  *(undefined8 *)(lVar2 + 0x198) = 0;
  *(undefined8 *)(lVar2 + 0x1a0) = 0;
  local_68.a.d.size = *(qsizetype *)(lVar2 + 0x1a8);
  *(undefined8 *)(lVar2 + 0x1a8) = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if ((pos->xp != 0.0) || (NAN(pos->xp))) {
LAB_004808cd:
    (**(code **)(*(long *)this + 0x70))(&local_68,this,pos);
    pDVar4 = *(Data **)(lVar2 + 0x198);
    pcVar5 = *(char16_t **)(lVar2 + 0x1a0);
    *(Data **)(lVar2 + 0x198) = local_68.a.d.d;
    *(char16_t **)(lVar2 + 0x1a0) = local_68.a.d.ptr;
    qVar3 = *(qsizetype *)(lVar2 + 0x1a8);
    *(qsizetype *)(lVar2 + 0x1a8) = local_68.a.d.size;
    local_68.a.d.d = pDVar4;
    local_68.a.d.ptr = pcVar5;
    local_68.a.d.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  else if ((pos->yp != 0.0) || (NAN(pos->yp))) goto LAB_004808cd;
  if (((uVar1 & 0x13) == 0) && (*(long *)(lVar2 + 0x1a8) == 0)) {
    local_2c0 = (QWidget *)0x0;
    goto LAB_00481939;
  }
  local_2c0 = (QWidget *)operator_new(0x28);
  QMenu::QMenu((QMenu *)local_2c0,parent);
  if ((*(byte *)(lVar2 + 0xb0) & 0x10) != 0) {
    tr((QString *)&local_128,"&Undo",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_70,Undo);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_004809c8;
      QKeySequence::QKeySequence(local_b0,Undo);
      QKeySequence::toString((SequenceFormat)&local_a8);
      local_90.b.d.size = local_a8.size;
      local_90.b.d.ptr = local_a8.ptr;
      local_90.b.d.d = local_a8.d;
      local_90.a = L'\t';
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_198,&local_90);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_004809c8:
      bVar7 = bVar7 ^ 1;
      local_198.a = L'\0';
      local_198._2_6_ = 0;
      local_198.b.d.d = (Data *)0x0;
      local_198.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_128,(QString *)&local_198);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_d8,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_d8,(QObject *)this,"1undo()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QKeySequence::~QKeySequence(local_b0);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_70);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    QTextDocument::isUndoAvailable();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_d8.a = L'\0';
    local_d8._2_6_ = 0;
    local_d8.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_d8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    local_d8.a = L'\0';
    local_d8._2_6_ = 0;
    local_d8.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_d8.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    tr((QString *)&local_198,"&Redo",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_b8,Redo);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_00480c12;
      QKeySequence::QKeySequence(local_100,Redo);
      QKeySequence::toString((SequenceFormat)&local_f8);
      local_d8.b.d.size = local_f8.size;
      local_d8.b.d.ptr = local_f8.ptr;
      local_d8.b.d.d = local_f8.d;
      local_d8.a = L'\t';
      local_f8.d = (Data *)0x0;
      local_f8.ptr = (char16_t *)0x0;
      local_f8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_208,&local_d8);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_00480c12:
      bVar7 = bVar7 ^ 1;
      local_208.a = L'\0';
      local_208._2_6_ = 0;
      local_208.b.d.d = (Data *)0x0;
      local_208.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_198,(QString *)&local_208);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_128,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_128,(QObject *)this,"1redo()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
      QKeySequence::~QKeySequence(local_100);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_b8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    QTextDocument::isRedoAvailable();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_128.a = L'\0';
    local_128._2_6_ = 0;
    local_128.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_128.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    local_128.a = L'\0';
    local_128._2_6_ = 0;
    local_128.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_128.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    QMenu::addSeparator((QMenu *)local_2c0);
    tr((QString *)&local_208,"Cu&t",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_108,Cut);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_00480e62;
      QKeySequence::QKeySequence(local_150,Cut);
      QKeySequence::toString((SequenceFormat)&local_148);
      local_128.b.d.size = local_148.size;
      local_128.b.d.ptr = local_148.ptr;
      local_128.b.d.d = local_148.d;
      local_128.a = L'\t';
      local_148.d = (Data *)0x0;
      local_148.ptr = (char16_t *)0x0;
      local_148.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_278,&local_128);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_00480e62:
      bVar7 = bVar7 ^ 1;
      local_278.a = L'\0';
      local_278._2_6_ = 0;
      local_278.b.d.d = (Data *)0x0;
      local_278.b.d.ptr = (char16_t *)0x0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_208,(QString *)&local_278);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_198,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_198,(QObject *)this,"1cut()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QKeySequence::~QKeySequence(local_150);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_108);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_198.a = L'\0';
    local_198._2_6_ = 0;
    local_198.b.d.d = (Data *)0x0;
    local_198.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
    local_198.a = L'\0';
    local_198._2_6_ = 0;
    local_198.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_198.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 8;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
  }
  if ((uVar1 & 0x13) != 0) {
    tr((QString *)&local_278,"&Copy",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_170,Copy);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_004810ab;
      QKeySequence::QKeySequence(local_1c0,Copy);
      QKeySequence::toString((SequenceFormat)&local_1b8);
      local_198.b.d.size = local_1b8.size;
      local_198.b.d.ptr = local_1b8.ptr;
      local_198.b.d.d = local_1b8.d;
      local_198.a = L'\t';
      local_1b8.d = (Data *)0x0;
      local_1b8.ptr = (char16_t *)0x0;
      local_1b8.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_168,&local_198);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_004810ab:
      bVar7 = bVar7 ^ 1;
      local_168.d = (Data *)0x0;
      local_168.ptr = (char16_t *)0x0;
      local_168.size = 0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_278,(QString *)&local_168);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_208,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_208,(QObject *)this,"1copy()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
      QKeySequence::~QKeySequence(local_1c0);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_170);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_208.a = L'\0';
    local_208._2_6_ = 0;
    local_208.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-copy";
    local_208.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    local_208.a = L'\0';
    local_208._2_6_ = 0;
    local_208.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-copy";
    local_208.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
  }
  uVar9 = *(uint *)(lVar2 + 0xb0);
  if ((uVar9 & 0xc) != 0) {
    tr(&local_68.a,"Copy &Link Location",(char *)0x0,-1);
    pQVar10 = QWidget::addAction(local_2c0,&local_68.a,(QObject *)this,"1_q_copyLink()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_208.a = L'\0';
    local_208._2_6_ = 0;
    local_208.b.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"link-copy";
    local_208.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
    uVar9 = *(uint *)(lVar2 + 0xb0);
  }
  if ((uVar9 & 0x10) != 0) {
    tr((QString *)&local_168,"&Paste",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_1e0,Paste);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_004813c1;
      QKeySequence::QKeySequence(local_230,Paste);
      QKeySequence::toString((SequenceFormat)&local_228);
      local_208.b.d.size = local_228.size;
      local_208.b.d.ptr = local_228.ptr;
      local_208.b.d.d = local_228.d;
      local_208.a = L'\t';
      local_228.d = (Data *)0x0;
      local_228.ptr = (char16_t *)0x0;
      local_228.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_1d8,&local_208);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_004813c1:
      bVar7 = bVar7 ^ 1;
      local_1d8.d = (Data *)0x0;
      local_1d8.ptr = (char16_t *)0x0;
      local_1d8.size = 0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_168,(QString *)&local_1d8);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_278,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_278,(QObject *)this,"1paste()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
      QKeySequence::~QKeySequence(local_230);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_1e0);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    canPaste(this);
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_278.a = L'\0';
    local_278._2_6_ = 0;
    local_278.b.d.d = (Data *)0x0;
    local_278.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    local_278.a = L'\0';
    local_278._2_6_ = 0;
    local_278.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_278.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 10;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    tr(&local_68.a,"Delete",(char *)0x0,-1);
    pQVar10 = QWidget::addAction(local_2c0,&local_68.a,(QObject *)this,"1_q_deleteSelected()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_278.a = L'\0';
    local_278._2_6_ = 0;
    local_278.b.d.d = (Data *)0x0;
    local_278.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
    local_278.a = L'\0';
    local_278._2_6_ = 0;
    local_278.b.d.d = (Data *)0x0;
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_278.b.d.ptr = (char16_t *)0x0;
    local_68.a.d.size = 0xb;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_278);
  }
  if ((uVar1 & 0x13) != 0) {
    QMenu::addSeparator((QMenu *)local_2c0);
    tr((QString *)&local_1d8,"Select All",(char *)0x0,-1);
    bVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar7 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_250,SelectAll);
      cVar8 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar8 != '\0') goto LAB_00481706;
      QKeySequence::QKeySequence(local_2a0,SelectAll);
      QKeySequence::toString((SequenceFormat)&local_298);
      local_278.b.d.size = local_298.size;
      local_278.b.d.ptr = local_298.ptr;
      local_278.b.d.d = local_298.d;
      local_278.a = L'\t';
      local_298.d = (Data *)0x0;
      local_298.ptr = (char16_t *)0x0;
      local_298.size = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_248,&local_278);
      bVar7 = 1;
      bVar6 = true;
    }
    else {
LAB_00481706:
      bVar7 = bVar7 ^ 1;
      local_248.d = (Data *)0x0;
      local_248.ptr = (char16_t *)0x0;
      local_248.size = 0;
      bVar6 = false;
    }
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_68,(QString *)&local_1d8,(QString *)&local_248);
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_168,&local_68);
    pQVar10 = QWidget::addAction(local_2c0,(QString *)&local_168,(QObject *)this,"1selectAll()",
                                 AutoConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
    if (bVar6) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
      QKeySequence::~QKeySequence(local_2a0);
    }
    if (bVar7 != 0) {
      QKeySequence::~QKeySequence(local_250);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d8);
    QTextDocument::isEmpty();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_168.d = (Data *)0x0;
    local_168.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"select-all";
    local_168.size = 0;
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    local_68.a.d.d = (Data *)0x0;
    local_168.d = (Data *)0x0;
    local_168.ptr = (char16_t *)0x0;
    local_68.a.d.ptr = L"edit-select-all";
    local_168.size = 0;
    local_68.a.d.size = 0xf;
    setActionIcon(pQVar10,&local_68.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  }
  if ((*(byte *)(lVar2 + 0xb0) & 0x10) != 0) {
    QGuiApplication::styleHints();
    cVar8 = QStyleHints::useRtlExtensions();
    if (cVar8 != '\0') {
      QMenu::addSeparator((QMenu *)local_2c0);
      this_00 = (QUnicodeControlCharacterMenu *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu(this_00,(QObject *)this,local_2c0);
      QMenu::addMenu((QMenu *)local_2c0,(QMenu *)this_00);
    }
  }
LAB_00481939:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)local_2c0;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QWidgetTextControl::createStandardContextMenu(const QPointF &pos, QWidget *parent)
{
    Q_D(QWidgetTextControl);

    const bool showTextSelectionActions = d->interactionFlags & (Qt::TextEditable | Qt::TextSelectableByKeyboard | Qt::TextSelectableByMouse);

    d->linkToCopy = QString();
    if (!pos.isNull())
        d->linkToCopy = anchorAt(pos);

    if (d->linkToCopy.isEmpty() && !showTextSelectionActions)
        return nullptr;

    QMenu *menu = new QMenu(parent);
    QAction *a;

    if (d->interactionFlags & Qt::TextEditable) {
        a = menu->addAction(tr("&Undo") + ACCEL_KEY(QKeySequence::Undo), this, SLOT(undo()));
        a->setEnabled(d->doc->isUndoAvailable());
        a->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(a, QStringLiteral("edit-undo"));
        a = menu->addAction(tr("&Redo") + ACCEL_KEY(QKeySequence::Redo), this, SLOT(redo()));
        a->setEnabled(d->doc->isRedoAvailable());
        a->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(a, QStringLiteral("edit-redo"));
        menu->addSeparator();

#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut), this, SLOT(cut()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(a, QStringLiteral("edit-cut"));
#endif
    }

#ifndef QT_NO_CLIPBOARD
    if (showTextSelectionActions) {
        a = menu->addAction(tr("&Copy") + ACCEL_KEY(QKeySequence::Copy), this, SLOT(copy()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-copy"));
        setActionIcon(a, QStringLiteral("edit-copy"));
    }

    if ((d->interactionFlags & Qt::LinksAccessibleByKeyboard)
            || (d->interactionFlags & Qt::LinksAccessibleByMouse)) {

        a = menu->addAction(tr("Copy &Link Location"), this, SLOT(_q_copyLink()));
        a->setEnabled(!d->linkToCopy.isEmpty());
        a->setObjectName(QStringLiteral("link-copy"));
    }
#endif // QT_NO_CLIPBOARD

    if (d->interactionFlags & Qt::TextEditable) {
#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("&Paste") + ACCEL_KEY(QKeySequence::Paste), this, SLOT(paste()));
        a->setEnabled(canPaste());
        a->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(a, QStringLiteral("edit-paste"));
#endif
        a = menu->addAction(tr("Delete"), this, SLOT(_q_deleteSelected()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(a, QStringLiteral("edit-delete"));
    }


    if (showTextSelectionActions) {
        menu->addSeparator();
        a = menu->addAction(tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll), this, SLOT(selectAll()));
        a->setEnabled(!d->doc->isEmpty());
        a->setObjectName(QStringLiteral("select-all"));
        setActionIcon(a, QStringLiteral("edit-select-all"));
    }

    if ((d->interactionFlags & Qt::TextEditable) && QGuiApplication::styleHints()->useRtlExtensions()) {
        menu->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, menu);
        menu->addMenu(ctrlCharacterMenu);
    }

    return menu;
}